

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

cmsysProcess * cmsysProcess_New(void)

{
  cmsysProcess *pcVar1;
  
  pcVar1 = (cmsysProcess *)calloc(1,0xd78);
  if (pcVar1 != (cmsysProcess *)0x0) {
    pcVar1->PipeSharedSTDIN = 1;
    pcVar1->PipeNativeSTDIN[0] = -1;
    pcVar1->PipeNativeSTDIN[1] = -1;
    pcVar1->PipeNativeSTDOUT[0] = -1;
    pcVar1->PipeNativeSTDOUT[1] = -1;
    pcVar1->PipeNativeSTDERR[0] = -1;
    pcVar1->PipeNativeSTDERR[1] = -1;
    pcVar1->State = 0;
  }
  return pcVar1;
}

Assistant:

kwsysProcess* kwsysProcess_New(void)
{
  /* Allocate a process control structure.  */
  kwsysProcess* cp = (kwsysProcess*)malloc(sizeof(kwsysProcess));
  if(!cp)
    {
    return 0;
    }
  memset(cp, 0, sizeof(kwsysProcess));

  /* Share stdin with the parent process by default.  */
  cp->PipeSharedSTDIN = 1;

  /* No native pipes by default.  */
  cp->PipeNativeSTDIN[0] = -1;
  cp->PipeNativeSTDIN[1] = -1;
  cp->PipeNativeSTDOUT[0] = -1;
  cp->PipeNativeSTDOUT[1] = -1;
  cp->PipeNativeSTDERR[0] = -1;
  cp->PipeNativeSTDERR[1] = -1;

  /* Set initial status.  */
  cp->State = kwsysProcess_State_Starting;

  return cp;
}